

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O3

ostream * om::net::operator<<(ostream *os_,mac_addr *a_)

{
  ostream *poVar1;
  string local_30;
  
  mac_addr::to_string_abi_cxx11_(&local_30,a_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os_,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os_, mac_addr& a_)
			{
				return (os_ << a_.to_string());
			}